

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O2

int __thiscall QuantNet::get_input_names(QuantNet *this)

{
  pointer ppLVar1;
  Layer *pLVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  string name;
  allocator<char> local_59;
  ulong local_58;
  value_type local_50;
  
  for (local_58 = 0;
      ppLVar1 = (this->super_Net).layers.
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      local_58 <
      (ulong)((long)(this->super_Net).layers.
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3); local_58 = local_58 + 1
      ) {
    pLVar2 = ppLVar1[local_58];
    bVar4 = std::operator==(&pLVar2->type,"Input");
    if (bVar4) {
      for (uVar5 = 0;
          lVar3 = *(long *)&(pLVar2->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data,
          uVar5 < (ulong)((long)*(pointer *)
                                 ((long)&(pLVar2->tops).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
                          - lVar3 >> 2); uVar5 = uVar5 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,
                   (this->super_Net).blobs.
                   super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                   super__Vector_impl_data._M_start[*(int *)(lVar3 + uVar5 * 4)].name._M_dataplus.
                   _M_p,&local_59);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->input_names,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  return 0;
}

Assistant:

int QuantNet::get_input_names()
{
    for (size_t i=0; i<layers.size(); i++)
    {
        ncnn::Layer* layer = layers[i];
        if (layer->type == "Input")
        {
            for (size_t  j=0; j<layer->tops.size(); j++)
            {
                int blob_index = layer->tops[j];
                std::string name = blobs[blob_index].name.c_str();
                input_names.push_back(name);
            }
        }
    }

    return 0;
}